

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar **ppuVar2;
  byte bVar3;
  byte bVar4;
  uint j;
  size_t sVar5;
  long lVar6;
  vector_brodnik<unsigned_char_*> *this;
  long lVar7;
  size_t N_00;
  long lVar8;
  size_t sVar9;
  long lVar10;
  uint j_1;
  uchar **ppuVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  array<vector_brodnik<unsigned_char_*>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  long local_158;
  ulong local_150;
  vector_brodnik<unsigned_char_*> local_100;
  vector_brodnik<unsigned_char_*> local_c8;
  vector_brodnik<unsigned_char_*> local_90;
  size_t local_58;
  byte abStack_50 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar12 = 0;
  do {
    this = (vector_brodnik<unsigned_char_*> *)
           ((long)&local_100._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar12);
    (this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)
     ((long)&local_100._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar12) = 0;
    *(undefined8 *)
     ((long)&local_100._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar12) = 0;
    vector_brodnik<unsigned_char_*>::clear(this);
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0xa8);
  bVar3 = pseudo_median<unsigned_char>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    sVar9 = 0;
  }
  else {
    sVar9 = 0;
    ppuVar11 = strings;
    do {
      lVar12 = 0;
      do {
        if (ppuVar11[lVar12] == (uchar *)0x0) goto LAB_001ab80a;
        abStack_50[lVar12] = ppuVar11[lVar12][depth];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x20);
      lVar12 = 0;
      do {
        lVar6 = (ulong)(abStack_50[lVar12] == bVar3) + (ulong)(bVar3 < abStack_50[lVar12]) * 2;
        if ((&local_100)[lVar6]._left_in_block == 0) {
          vector_brodnik<unsigned_char_*>::grow(&local_100 + lVar6);
        }
        puVar1 = ppuVar11[lVar12];
        ppuVar2 = (&local_100)[lVar6]._insertpos;
        (&local_100)[lVar6]._insertpos = ppuVar2 + 1;
        *ppuVar2 = puVar1;
        (&local_100)[lVar6]._left_in_block = (&local_100)[lVar6]._left_in_block - 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x20);
      sVar9 = sVar9 + 0x20;
      ppuVar11 = ppuVar11 + 0x20;
    } while (sVar9 < (N & 0xffffffffffffffe0));
  }
  if (sVar9 < N) {
    do {
      if (strings[sVar9] == (uchar *)0x0) {
LAB_001ab80a:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar4 = strings[sVar9][depth];
      lVar12 = (ulong)(bVar4 == bVar3) + (ulong)(bVar3 < bVar4) * 2;
      if ((&local_100)[lVar12]._left_in_block == 0) {
        vector_brodnik<unsigned_char_*>::grow(&local_100 + lVar12);
      }
      puVar1 = strings[sVar9];
      ppuVar11 = (&local_100)[lVar12]._insertpos;
      (&local_100)[lVar12]._insertpos = ppuVar11 + 1;
      *ppuVar11 = puVar1;
      (&local_100)[lVar12]._left_in_block = (&local_100)[lVar12]._left_in_block - 1;
      sVar9 = sVar9 + 1;
    } while (N != sVar9);
  }
  lVar6 = (long)(2 << (local_100._superblock & 0x1f)) + -0x40;
  lVar12 = local_100._left_in_superblock * local_100._block_size + local_100._left_in_block;
  N_00 = lVar6 - lVar12;
  lVar15 = local_c8._left_in_superblock * local_c8._block_size + local_c8._left_in_block;
  lVar10 = (long)(2 << (local_c8._superblock & 0x1f)) + -0x40;
  sVar9 = lVar10 - lVar15;
  lVar7 = (long)(2 << (local_90._superblock & 0x1f)) + -0x40;
  lVar8 = local_90._left_in_superblock * local_90._block_size + local_90._left_in_block;
  local_58 = lVar7 - lVar8;
  if (sVar9 + N_00 + local_58 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_brodnik<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (lVar6 != lVar12) {
    ppuVar11 = strings;
    if (local_100._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_100._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_158 = 8;
      local_150 = 0;
      lVar12 = 8;
      bVar4 = 0;
      do {
        if (lVar12 != 0) {
          uVar13 = local_150;
          lVar6 = lVar12;
          do {
            if (uVar13 == ((long)local_100._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_100._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_001ab4f0;
            if (local_158 != 0) {
              memmove(ppuVar11,local_100._index_block.
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar13],local_158 * 8);
            }
            uVar13 = uVar13 + 1;
            ppuVar11 = ppuVar11 + local_158;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        local_150 = local_150 + lVar12;
        lVar12 = lVar12 << bVar4;
        bVar4 = bVar4 ^ 1;
        local_158 = local_158 << bVar4;
      } while (local_150 <
               (ulong)((long)local_100._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_100._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_001ab4f0:
    sVar5 = (long)local_100._insertpos -
            (long)local_100._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar5 != 0) {
      memmove(ppuVar11,local_100._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar5);
    }
  }
  if (lVar10 != lVar15) {
    ppuVar11 = strings + N_00;
    if (local_c8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_c8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_158 = 8;
      uVar13 = 0;
      lVar12 = 8;
      bVar4 = 0;
      do {
        if (lVar12 != 0) {
          uVar14 = uVar13;
          lVar6 = lVar12;
          do {
            if (uVar14 == ((long)local_c8._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_c8._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_001ab5f9;
            if (local_158 != 0) {
              memmove(ppuVar11,local_c8._index_block.
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14],local_158 * 8);
            }
            uVar14 = uVar14 + 1;
            ppuVar11 = ppuVar11 + local_158;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        uVar13 = uVar13 + lVar12;
        lVar12 = lVar12 << bVar4;
        bVar4 = bVar4 ^ 1;
        local_158 = local_158 << bVar4;
      } while (uVar13 < (ulong)((long)local_c8._index_block.
                                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c8._index_block.
                                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_001ab5f9:
    sVar5 = (long)local_c8._insertpos -
            (long)local_c8._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar5 != 0) {
      memmove(ppuVar11,local_c8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar5);
    }
  }
  if (lVar7 != lVar8) {
    ppuVar11 = strings + N_00 + sVar9;
    if (local_90._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_90._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_158 = 8;
      local_150 = 0;
      lVar12 = 8;
      bVar4 = 0;
      do {
        if (lVar12 != 0) {
          uVar13 = local_150;
          lVar6 = lVar12;
          do {
            if (uVar13 == ((long)local_90._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_90._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_001ab75c;
            if (local_158 != 0) {
              memmove(ppuVar11,local_90._index_block.
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar13],local_158 * 8);
            }
            uVar13 = uVar13 + 1;
            ppuVar11 = ppuVar11 + local_158;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        local_150 = local_150 + lVar12;
        lVar12 = lVar12 << bVar4;
        bVar4 = bVar4 ^ 1;
        local_158 = local_158 << bVar4;
      } while (local_150 <
               (ulong)((long)local_90._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_90._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_001ab75c:
    sVar5 = (long)local_90._insertpos -
            (long)local_90._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar5 != 0) {
      memmove(ppuVar11,local_90._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar5);
    }
  }
  vector_brodnik<unsigned_char_*>::clear(&local_100);
  vector_brodnik<unsigned_char_*>::clear(&local_c8);
  vector_brodnik<unsigned_char_*>::clear(&local_90);
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>(strings,N_00,depth);
  if (bVar3 != 0) {
    multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>(strings + N_00,sVar9,depth + 1);
  }
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>
            (strings + N_00 + sVar9,local_58,depth);
  lVar12 = 0x70;
  do {
    vector_brodnik<unsigned_char_*>::~vector_brodnik
              ((vector_brodnik<unsigned_char_*> *)
               ((long)&local_100._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + -0x38;
  } while (lVar12 != -0x38);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}